

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

int ncnn::from_rgb(uchar *rgb,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  bool bVar1;
  float *pfVar2;
  Mat *this;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  int remain;
  int y;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  Mat *in_stack_fffffffffffffed0;
  Mat *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  int iVar3;
  int in_stack_fffffffffffffeec;
  int iVar4;
  Mat *in_stack_fffffffffffffef0;
  float *local_d0;
  Mat local_c8;
  Mat *local_88;
  Mat local_80;
  float *local_40;
  int local_34;
  int local_1c;
  int local_18;
  int local_14;
  byte *local_10;
  int local_4;
  
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  Mat::create(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
              (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),(size_t)in_stack_fffffffffffffed8,
              (Allocator *)in_stack_fffffffffffffed0);
  bVar1 = Mat::empty(in_stack_fffffffffffffed0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_34 = local_1c + local_14 * -3;
    if (local_34 == 0) {
      local_14 = local_14 * local_18;
      local_18 = 1;
    }
    Mat::channel(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    pfVar2 = Mat::operator_cast_to_float_(&local_80);
    Mat::~Mat((Mat *)0x15ee5e);
    local_40 = pfVar2;
    Mat::channel(in_stack_fffffffffffffed8,(int)((ulong)pfVar2 >> 0x20));
    iVar4 = (int)((ulong)pfVar2 >> 0x20);
    this = (Mat *)Mat::operator_cast_to_float_(&local_c8);
    Mat::~Mat((Mat *)0x15ee9b);
    local_88 = this;
    Mat::channel(this,iVar4);
    local_d0 = Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffef0);
    Mat::~Mat((Mat *)0x15eed8);
    for (iVar4 = 0; iVar3 = local_14, iVar4 < local_18; iVar4 = iVar4 + 1) {
      for (; 0 < iVar3; iVar3 = iVar3 + -1) {
        *local_40 = (float)*local_10;
        *(float *)&local_88->data = (float)local_10[1];
        *local_d0 = (float)local_10[2];
        local_10 = local_10 + 3;
        local_40 = local_40 + 1;
        local_88 = (Mat *)((long)&local_88->data + 4);
        local_d0 = local_d0 + 1;
      }
      local_10 = local_10 + local_34;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int from_rgb(const unsigned char* rgb, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 3, 4u, allocator);
    if (m.empty())
        return -100;

    const int wgap = stride - w * 3;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    float* ptr0 = m.channel(0);
    float* ptr1 = m.channel(1);
    float* ptr2 = m.channel(2);

    for (int y=0; y<h; y++)
    {
#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
        for (; nn>0; nn--)
        {
            uint8x8x3_t _rgb = vld3_u8(rgb);
            uint16x8_t _r16 = vmovl_u8(_rgb.val[0]);
            uint16x8_t _g16 = vmovl_u8(_rgb.val[1]);
            uint16x8_t _b16 = vmovl_u8(_rgb.val[2]);

            float32x4_t _rlow = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_r16)));
            float32x4_t _rhigh = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_r16)));
            float32x4_t _glow = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_g16)));
            float32x4_t _ghigh = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_g16)));
            float32x4_t _blow = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_b16)));
            float32x4_t _bhigh = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_b16)));

            vst1q_f32(ptr0, _rlow);
            vst1q_f32(ptr0+4, _rhigh);
            vst1q_f32(ptr1, _glow);
            vst1q_f32(ptr1+4, _ghigh);
            vst1q_f32(ptr2, _blow);
            vst1q_f32(ptr2+4, _bhigh);

            rgb += 3*8;
            ptr0 += 8;
            ptr1 += 8;
            ptr2 += 8;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "0:                             \n"
            "pld        [%1, #256]          \n"
            "vld3.u8    {d0-d2}, [%1]!      \n"
            "vmovl.u8   q8, d0              \n"
            "vmovl.u8   q9, d1              \n"
            "vmovl.u8   q10, d2             \n"
            "vmovl.u16  q0, d16             \n"
            "vmovl.u16  q1, d17             \n"
            "vmovl.u16  q2, d18             \n"
            "vmovl.u16  q3, d19             \n"
            "vmovl.u16  q8, d20             \n"
            "vmovl.u16  q9, d21             \n"
            "vcvt.f32.u32   q0, q0          \n"
            "vcvt.f32.u32   q1, q1          \n"
            "vcvt.f32.u32   q2, q2          \n"
            "vcvt.f32.u32   q3, q3          \n"
            "vcvt.f32.u32   q8, q8          \n"
            "subs       %0, #1              \n"
            "vst1.f32   {d0-d3}, [%2 :128]! \n"
            "vcvt.f32.u32   q9, q9          \n"
            "vst1.f32   {d4-d7}, [%3 :128]! \n"
            "vst1.f32   {d16-d19}, [%4 :128]!\n"
            "bne        0b                  \n"
            : "=r"(nn),     // %0
              "=r"(rgb),    // %1
              "=r"(ptr0),   // %2
              "=r"(ptr1),   // %3
              "=r"(ptr2)    // %4
            : "0"(nn),
              "1"(rgb),
              "2"(ptr0),
              "3"(ptr1),
              "4"(ptr2)
            : "cc", "memory", "q0", "q1", "q2", "q3", "q8", "q9", "q10"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain>0; remain--)
        {
            *ptr0 = rgb[0];
            *ptr1 = rgb[1];
            *ptr2 = rgb[2];

            rgb += 3;
            ptr0++;
            ptr1++;
            ptr2++;
        }

        rgb += wgap;
    }

    return 0;
}